

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O2

void __thiscall cppnet::BlockMemoryPool::PoolLargeFree(BlockMemoryPool *this,void **m)

{
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->_free_mem_vec,m);
  if (0xa0 < (ulong)((long)(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    (*this->_vptr_BlockMemoryPool[6])(this);
    return;
  }
  return;
}

Assistant:

void BlockMemoryPool::PoolLargeFree(void* &m) {
    bool release = false;
    {
#ifdef __use_iocp__
        std::lock_guard<std::mutex> lock(_mutex);
#endif
        _free_mem_vec.push_back(m);

        if (_free_mem_vec.size() > __max_block_num) {
            release = true;
        }
    }
    
    // release some block.
    if (release) {
        ReleaseHalf();
    }
}